

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::DockSpaceOverViewport
                  (ImGuiViewport *viewport,ImGuiDockNodeFlags dockspace_flags,
                  ImGuiWindowClass *window_class)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  ImGuiID IVar11;
  ImGuiContext *g;
  char label [32];
  ImVec2 local_60;
  char local_58 [40];
  
  if (viewport == (ImGuiViewport *)0x0) {
    viewport = GetMainViewport();
  }
  pIVar10 = GImGui;
  fVar1 = (viewport->Pos).x;
  fVar2 = (viewport->Pos).y;
  fVar3 = (viewport->WorkOffsetMin).x;
  fVar4 = (viewport->WorkOffsetMin).y;
  uVar7 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar7 | 1;
  IVar8.y = fVar2 + fVar4;
  IVar8.x = fVar1 + fVar3;
  (pIVar10->NextWindowData).PosVal = IVar8;
  (pIVar10->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar10->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar10->NextWindowData).PosCond = 1;
  (pIVar10->NextWindowData).PosUndock = true;
  fVar1 = (viewport->Size).x;
  fVar2 = (viewport->Size).y;
  fVar3 = (viewport->WorkOffsetMin).x;
  fVar4 = (viewport->WorkOffsetMax).x;
  fVar5 = (viewport->WorkOffsetMin).y;
  fVar6 = (viewport->WorkOffsetMax).y;
  (pIVar10->NextWindowData).Flags = uVar7 | 3;
  IVar9.y = (fVar2 - fVar5) + fVar6;
  IVar9.x = (fVar1 - fVar3) + fVar4;
  (pIVar10->NextWindowData).SizeVal = IVar9;
  (pIVar10->NextWindowData).SizeCond = 1;
  IVar11 = viewport->ID;
  (pIVar10->NextWindowData).Flags = uVar7 | 0x103;
  (pIVar10->NextWindowData).ViewportId = IVar11;
  ImFormatString(local_58,0x20,"DockSpaceViewport_%08X",(ulong)viewport->ID);
  PushStyleVar(2,0.0);
  PushStyleVar(3,0.0);
  local_60.x = 0.0;
  local_60.y = 0.0;
  PushStyleVar(1,&local_60);
  Begin(local_58,(bool *)0x0,(dockspace_flags & 8U) << 4 | 0x282027);
  PopStyleVar(3);
  IVar11 = ImGuiWindow::GetID(GImGui->CurrentWindow,"DockSpace",(char *)0x0);
  local_60.x = 0.0;
  local_60.y = 0.0;
  DockSpace(IVar11,&local_60,dockspace_flags,window_class);
  End();
  return IVar11;
}

Assistant:

ImGuiID ImGui::DockSpaceOverViewport(ImGuiViewport* viewport, ImGuiDockNodeFlags dockspace_flags, const ImGuiWindowClass* window_class)
{
    if (viewport == NULL)
        viewport = GetMainViewport();

    SetNextWindowPos(viewport->GetWorkPos());
    SetNextWindowSize(viewport->GetWorkSize());
    SetNextWindowViewport(viewport->ID);

    ImGuiWindowFlags host_window_flags = 0;
    host_window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    host_window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus | ImGuiWindowFlags_NoNavFocus;
    if (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode)
        host_window_flags |= ImGuiWindowFlags_NoBackground;

    char label[32];
    ImFormatString(label, IM_ARRAYSIZE(label), "DockSpaceViewport_%08X", viewport->ID);

    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0.0f, 0.0f));
    Begin(label, NULL, host_window_flags);
    PopStyleVar(3);

    ImGuiID dockspace_id = GetID("DockSpace");
    DockSpace(dockspace_id, ImVec2(0.0f, 0.0f), dockspace_flags, window_class);
    End();

    return dockspace_id;
}